

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

char * golf_file_copy_line(char *string,char **line_buffer,int *line_buffer_len)

{
  char *pcVar1;
  ulong uVar2;
  
  if ((string == (char *)0x0) || (*string == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    for (uVar2 = 0; (string[uVar2] != '\0' && (string[uVar2] != '\n')); uVar2 = uVar2 + 1) {
      if (uVar2 == (uint)*line_buffer_len) {
        _grow_buffer(line_buffer,line_buffer_len);
      }
      (*line_buffer)[uVar2] = string[uVar2];
    }
    if ((uVar2 != 0) && ((*line_buffer)[uVar2 - 1] == '\r')) {
      (*line_buffer)[uVar2 - 1] = '\0';
    }
    if (*line_buffer_len == (int)uVar2) {
      _grow_buffer(line_buffer,line_buffer_len);
    }
    pcVar1 = string + uVar2;
    (*line_buffer)[uVar2] = '\0';
  }
  return pcVar1;
}

Assistant:

const char *golf_file_copy_line(const char *string, char **line_buffer, int *line_buffer_len) {
    if (!string || !string[0]) {
        return NULL;
    }

    int i = 0;
    while (string[i] != '\n' && string[i]) {
        if (i == *line_buffer_len) {
            _grow_buffer(line_buffer, line_buffer_len);
        }
        (*line_buffer)[i] = string[i];
        i++;
    }
    if (i > 0 && (*line_buffer)[i - 1] == '\r') {
        (*line_buffer)[i - 1] = 0;
    }

    // Allocate room for the null character if needed.
    if (i == *line_buffer_len) {
        _grow_buffer(line_buffer, line_buffer_len);
    }
    (*line_buffer)[i] = 0;

    return string + i;
}